

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::Buffer(Buffer *this,char *buf,off_t length)

{
  ulong uVar1;
  char *__dest;
  
  uVar1 = 0xffffffffffffffff;
  if (-1 < length) {
    uVar1 = length;
  }
  this->rightIndex_ = 0;
  this->capacity_ = 0;
  this->buffer_ = (char *)0x0;
  this->leftIndex_ = 0;
  __dest = (char *)operator_new__(uVar1);
  this->buffer_ = __dest;
  memcpy(__dest,buf,length);
  this->leftIndex_ = 0;
  this->rightIndex_ = length;
  this->capacity_ = length;
  return;
}

Assistant:

Buffer::Buffer(const char *buf, off_t length) {
    buffer_ = new char[length];
    ::memcpy(buffer_, buf, length);
    leftIndex_ = 0;
    rightIndex_ = length;
    capacity_ = length;
}